

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_add_item(nghttp2_session *session,nghttp2_outbound_item *item)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  nghttp2_outbound_queue *q;
  nghttp2_priority_spec pri_spec;
  nghttp2_priority_spec local_2c;
  
  pnVar2 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(item->frame).hd.stream_id);
  if ((pnVar2 == (nghttp2_stream *)0x0) || ((pnVar2->flags & 2) != 0)) {
    pnVar2 = (nghttp2_stream *)0x0;
  }
  else if (pnVar2->state == NGHTTP2_STREAM_IDLE) {
    pnVar2 = (nghttp2_stream *)0x0;
  }
  switch((item->frame).hd.type) {
  case '\0':
    if (pnVar2 == (nghttp2_stream *)0x0) {
      return -0x1fe;
    }
    if (pnVar2->item != (nghttp2_outbound_item *)0x0) {
      return -0x211;
    }
    iVar1 = nghttp2_stream_attach_item(pnVar2,item);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((pnVar2->flags & 0x10) != 0) {
      iVar1 = session_ob_data_push(session,pnVar2);
      return iVar1;
    }
    return 0;
  case '\x01':
    if (((item->frame).headers.cat == NGHTTP2_HCAT_REQUEST) ||
       ((pnVar2 != (nghttp2_stream *)0x0 && (pnVar2->state == NGHTTP2_STREAM_RESERVED)))) {
      q = &session->ob_syn;
      goto LAB_0062cefc;
    }
    break;
  case '\x03':
    if (pnVar2 != (nghttp2_stream *)0x0) {
      pnVar2->state = NGHTTP2_STREAM_CLOSING;
    }
    break;
  case '\x04':
  case '\x06':
    q = &session->ob_urgent;
    goto LAB_0062cefc;
  case '\x05':
    if (pnVar2 == (nghttp2_stream *)0x0) {
      return -0x1fe;
    }
    nghttp2_priority_spec_init(&local_2c,pnVar2->stream_id,0x10,0);
    pnVar2 = nghttp2_session_open_stream
                       (session,(item->frame).push_promise.promised_stream_id,'\0',&local_2c,
                        NGHTTP2_STREAM_RESERVED,(item->aux_data).headers.stream_user_data);
    if (pnVar2 == (nghttp2_stream *)0x0) {
      return -0x385;
    }
    nghttp2_outbound_queue_push(&session->ob_reg,item);
    item->queued = '\x01';
    return 0;
  case '\b':
    if (pnVar2 == (nghttp2_stream *)0x0) {
      if ((item->frame).hd.stream_id == 0) {
        session->window_update_queued = '\x01';
      }
    }
    else {
      pnVar2->window_update_queued = '\x01';
    }
  }
  q = &session->ob_reg;
LAB_0062cefc:
  nghttp2_outbound_queue_push(q,item);
  item->queued = '\x01';
  return 0;
}

Assistant:

int nghttp2_session_add_item(nghttp2_session *session,
                             nghttp2_outbound_item *item) {
  /* TODO Return error if stream is not found for the frame requiring
     stream presence. */
  int rv = 0;
  nghttp2_stream *stream;
  nghttp2_frame *frame;

  frame = &item->frame;
  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);

  switch (frame->hd.type) {
  case NGHTTP2_DATA:
    if (!stream) {
      return NGHTTP2_ERR_STREAM_CLOSED;
    }

    if (stream->item) {
      return NGHTTP2_ERR_DATA_EXIST;
    }

    rv = session_attach_stream_item(session, stream, item);

    if (rv != 0) {
      return rv;
    }

    return 0;
  case NGHTTP2_HEADERS:
    /* We push request HEADERS and push response HEADERS to
       dedicated queue because their transmission is affected by
       SETTINGS_MAX_CONCURRENT_STREAMS */
    /* TODO If 2 HEADERS are submitted for reserved stream, then
       both of them are queued into ob_syn, which is not
       desirable. */
    if (frame->headers.cat == NGHTTP2_HCAT_REQUEST ||
        (stream && stream->state == NGHTTP2_STREAM_RESERVED)) {
      nghttp2_outbound_queue_push(&session->ob_syn, item);
      item->queued = 1;
      return 0;
      ;
    }

    nghttp2_outbound_queue_push(&session->ob_reg, item);
    item->queued = 1;
    return 0;
  case NGHTTP2_SETTINGS:
  case NGHTTP2_PING:
    nghttp2_outbound_queue_push(&session->ob_urgent, item);
    item->queued = 1;
    return 0;
  case NGHTTP2_RST_STREAM:
    if (stream) {
      stream->state = NGHTTP2_STREAM_CLOSING;
    }
    nghttp2_outbound_queue_push(&session->ob_reg, item);
    item->queued = 1;
    return 0;
  case NGHTTP2_PUSH_PROMISE: {
    nghttp2_headers_aux_data *aux_data;
    nghttp2_priority_spec pri_spec;

    aux_data = &item->aux_data.headers;

    if (!stream) {
      return NGHTTP2_ERR_STREAM_CLOSED;
    }

    nghttp2_priority_spec_init(&pri_spec, stream->stream_id,
                               NGHTTP2_DEFAULT_WEIGHT, 0);

    if (!nghttp2_session_open_stream(
            session, frame->push_promise.promised_stream_id,
            NGHTTP2_STREAM_FLAG_NONE, &pri_spec, NGHTTP2_STREAM_RESERVED,
            aux_data->stream_user_data)) {
      return NGHTTP2_ERR_NOMEM;
    }

    /* We don't have to call nghttp2_session_adjust_closed_stream()
       here, since stream->stream_id is local stream_id, and it does
       not affect closed stream count. */

    nghttp2_outbound_queue_push(&session->ob_reg, item);
    item->queued = 1;

    return 0;
  }
  case NGHTTP2_WINDOW_UPDATE:
    if (stream) {
      stream->window_update_queued = 1;
    } else if (frame->hd.stream_id == 0) {
      session->window_update_queued = 1;
    }
    nghttp2_outbound_queue_push(&session->ob_reg, item);
    item->queued = 1;
    return 0;
  default:
    nghttp2_outbound_queue_push(&session->ob_reg, item);
    item->queued = 1;
    return 0;
  }
}